

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_general_print(emitter_t *emitter)

{
  tsd_t *ptVar1;
  _Bool _Var2;
  int iVar3;
  tsd_t *ptVar4;
  emitter_t *in_RDI;
  long *in_FS_OFFSET;
  size_t sz_25;
  size_t miblen_new_6;
  uint i_1;
  size_t miblen_new_5;
  size_t arenas_lextent_mib [7];
  size_t sz_24;
  uint nlextents;
  size_t sz_23;
  size_t miblen_new_4;
  size_t sz_22;
  size_t miblen_new_3;
  size_t sz_21;
  size_t miblen_new_2;
  size_t sz_20;
  size_t miblen_new_1;
  uint i;
  size_t miblen_new;
  size_t arenas_bin_mib [7];
  size_t sz_19;
  uint arenas_nhbins;
  size_t sz_18;
  uint arenas_nbins;
  size_t sz_17;
  size_t sz_16;
  size_t sz_15;
  size_t sz_14;
  size_t sz_13;
  size_t sz_12;
  char *bufp;
  char buf [21];
  char *neg1;
  size_t sz_11;
  size_t sz_10;
  size_t sz_9;
  size_t sz_8;
  size_t sz_7;
  size_t sz_6;
  size_t sz_5;
  size_t sz_4;
  size_t sz_3;
  size_t sz_2;
  size_t sz_1;
  size_t sz;
  size_t cpsz;
  size_t sssz;
  size_t ssz;
  size_t i64sz;
  size_t u64sz;
  size_t u32sz;
  size_t usz;
  size_t bsz;
  size_t sv;
  ssize_t ssv2;
  ssize_t ssv;
  int64_t i64v;
  uint64_t u64v;
  uint32_t u32v;
  uint uv;
  _Bool bv2;
  _Bool bv;
  char *cpv;
  tsd_t *tsd;
  tsd_t *tsd_1;
  tsd_t *tsd_2;
  tsd_t *tsd_3;
  tsd_t *tsd_4;
  tsd_t *tsd_5;
  tsd_t *tsd_6;
  char *in_stack_fffffffffffffc68;
  undefined8 *puVar5;
  undefined1 *value;
  emitter_t *in_stack_fffffffffffffc70;
  emitter_type_t eVar6;
  char *in_stack_fffffffffffffc78;
  undefined1 minimal;
  tsd_t *in_stack_fffffffffffffc80;
  size_t *in_stack_fffffffffffffc88;
  char *pcVar7;
  tsd_t *in_stack_fffffffffffffc90;
  size_t miblen;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  uint uVar8;
  tsd_t *in_stack_fffffffffffffca0;
  tsd_t *ptVar9;
  void *in_stack_fffffffffffffca8;
  size_t *in_stack_fffffffffffffcc0;
  void *in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcd0;
  uint local_30c;
  char local_308 [16];
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  uint local_2c4;
  uint local_264;
  emitter_t local_160;
  int local_13c;
  undefined1 local_132 [10];
  emitter_t *local_128;
  tsd_t *local_120;
  undefined1 local_112;
  undefined1 local_111;
  tsd_t *local_110;
  tsd_t *local_108;
  undefined1 local_fa;
  undefined1 local_f9;
  tsd_t *local_f8;
  tsd_t *local_f0;
  undefined1 local_e2;
  undefined1 local_e1;
  tsd_t *local_e0;
  tsd_t *local_d8;
  undefined1 local_ca;
  undefined1 local_c9;
  tsd_t *local_c8;
  tsd_t *local_c0;
  undefined1 local_b2;
  undefined1 local_b1;
  tsd_t *local_b0;
  tsd_t *local_a8;
  undefined1 local_9a;
  undefined1 local_99;
  tsd_t *local_98;
  tsd_t *local_90;
  undefined1 local_82;
  undefined1 local_81;
  tsd_t *local_80;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  tsd_t *local_70;
  tsd_t *local_68;
  tsd_t *local_60;
  tsd_t *local_58;
  tsd_t *local_50;
  tsd_t *local_48;
  tsd_t *local_40;
  tsd_t *local_38;
  tsd_t *local_30;
  tsd_t *local_28;
  tsd_t *local_20;
  tsd_t *local_18;
  tsd_t *local_10;
  tsd_t *local_8;
  
  local_128 = in_RDI;
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","version");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  emitter_dict_begin(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(char *)0x256a0b5);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.cache_oblivious");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.debug");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.fill");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.lazy_lock");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.opt_safety_checks");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.prof");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.prof_libgcc");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.prof_libunwind");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.stats");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.utrace");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","config.xmalloc");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  emitter_dict_end((emitter_t *)0x256a639);
  emitter_dict_begin(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(char *)0x256a654);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    local_132._2_8_ = anon_var_dwarf_3eb64fd + 9;
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    local_132._2_8_ = anon_var_dwarf_3eb64fd + 9;
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    local_132._2_8_ = anon_var_dwarf_3eb64fd + 9;
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    if (local_13c == -1) {
      emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 &in_stack_fffffffffffffc80->
                  cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                 (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                 in_stack_fffffffffffffc70);
    }
    else {
      duckdb_je_fxp_print((fxp_t)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                          (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 &in_stack_fffffffffffffc80->
                  cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                 (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                 in_stack_fffffffffffffc70);
    }
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if ((iVar3 == 0) &&
     (iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                                ,in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                                in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70),
     iVar3 == 0)) {
    in_stack_fffffffffffffc70 = (emitter_t *)local_132;
    in_stack_fffffffffffffc68 = (char *)((ulong)in_stack_fffffffffffffc68 & 0xffffffff00000000);
    emitter_kv_note((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                    &in_stack_fffffffffffffc80->
                     cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                    (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                    in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                    (emitter_type_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if ((iVar3 == 0) &&
     (iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                                ,in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                                in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70),
     iVar3 == 0)) {
    in_stack_fffffffffffffc70 = &local_160;
    in_stack_fffffffffffffc68 = (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffc68 >> 0x20),7);
    emitter_kv_note((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                    &in_stack_fffffffffffffc80->
                     cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                    (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                    in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                    (emitter_type_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if ((iVar3 == 0) &&
     (iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                                ,in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                                in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70),
     iVar3 == 0)) {
    in_stack_fffffffffffffc70 = &local_160;
    in_stack_fffffffffffffc68 = (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffc68 >> 0x20),7);
    emitter_kv_note((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                    &in_stack_fffffffffffffc80->
                     cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                    (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                    in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                    (emitter_type_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if ((iVar3 == 0) &&
     (iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                                ,in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                                in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70),
     iVar3 == 0)) {
    in_stack_fffffffffffffc70 = (emitter_t *)local_132;
    in_stack_fffffffffffffc68 = (char *)((ulong)in_stack_fffffffffffffc68 & 0xffffffff00000000);
    emitter_kv_note((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                    &in_stack_fffffffffffffc80->
                     cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                    (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                    in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                    (emitter_type_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if ((iVar3 == 0) &&
     (iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                                ,in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                                in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70),
     iVar3 == 0)) {
    in_stack_fffffffffffffc70 = (emitter_t *)local_132;
    in_stack_fffffffffffffc68 = (char *)((ulong)in_stack_fffffffffffffc68 & 0xffffffff00000000);
    emitter_kv_note((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                    &in_stack_fffffffffffffc80->
                     cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                    (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                    in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                    (emitter_type_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if ((iVar3 == 0) &&
     (iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                                ,in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                                in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70),
     iVar3 == 0)) {
    in_stack_fffffffffffffc70 = &local_160;
    in_stack_fffffffffffffc68 = (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffc68 >> 0x20),7);
    emitter_kv_note((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                    &in_stack_fffffffffffffc80->
                     cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                    (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                    in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                    (emitter_type_t)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  emitter_dict_end((emitter_t *)0x256be70);
  emitter_json_object_kv_begin(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.narenas");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.dirty_decay_ms");
    abort();
  }
  emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                  (emitter_type_t)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                  in_stack_fffffffffffffc68);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.muzzy_decay_ms");
    abort();
  }
  emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                  (emitter_type_t)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                  in_stack_fffffffffffffc68);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.quantum");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.page");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.hugepage");
    abort();
  }
  emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->
              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
             (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70);
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
  }
  iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  if (iVar3 == 0) {
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
    iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                              in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                              in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
    if (iVar3 != 0) {
      duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.nhbins");
      abort();
    }
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
    _Var2 = emitter_outputs_json(local_128);
    if (_Var2) {
      emitter_json_array_kv_begin(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      local_111 = 1;
      local_112 = 0;
      local_71 = 1;
      local_120 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
      local_110 = local_120;
      local_40 = local_120;
      ptVar4 = local_120;
      if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
        local_110 = duckdb_je_tsd_fetch_slow
                              (in_stack_fffffffffffffc80,
                               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
        ptVar4 = local_8;
      }
      local_8 = ptVar4;
      iVar3 = duckdb_je_ctl_mibnametomib
                        (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                         (size_t)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         (size_t *)in_stack_fffffffffffffc70);
      if (iVar3 != 0) {
        duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
        abort();
      }
      for (local_2c4 = 0; local_2c4 < local_264; local_2c4 = local_2c4 + 1) {
        emitter_json_object_begin((emitter_t *)0x256c42d);
        local_2d8 = 8;
        local_f9 = 1;
        local_fa = 0;
        local_72 = 1;
        local_108 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
        ptVar4 = local_108;
        local_48 = local_108;
        ptVar9 = local_108;
        if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow
                             (in_stack_fffffffffffffc80,
                              SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
          ptVar9 = local_10;
        }
        local_10 = ptVar9;
        local_f8 = ptVar4;
        puVar5 = &local_2d8;
        eVar6 = emitter_type_bool;
        pcVar7 = (char *)0x0;
        iVar3 = duckdb_je_ctl_bymibname
                          (in_stack_fffffffffffffca0,
                           (size_t *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (size_t)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                           (size_t *)in_stack_fffffffffffffc80,(void *)0x0,in_stack_fffffffffffffcc0
                           ,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
        if (iVar3 != 0) {
          duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
          abort();
        }
        emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,pcVar7,eVar6,puVar5);
        local_2e0 = 7;
        local_2e8 = 4;
        local_e1 = 1;
        local_e2 = 0;
        local_73 = 1;
        local_f0 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
        ptVar4 = local_f0;
        local_50 = local_f0;
        ptVar9 = local_f0;
        if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow
                             (in_stack_fffffffffffffc80,SUB81((ulong)pcVar7 >> 0x38,0));
          ptVar9 = local_18;
        }
        local_18 = ptVar9;
        local_e0 = ptVar4;
        puVar5 = &local_2e8;
        eVar6 = emitter_type_bool;
        pcVar7 = (char *)0x0;
        iVar3 = duckdb_je_ctl_bymibname
                          (in_stack_fffffffffffffca0,
                           (size_t *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (size_t)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                           (size_t *)in_stack_fffffffffffffc80,(void *)0x0,in_stack_fffffffffffffcc0
                           ,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
        if (iVar3 != 0) {
          duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
          abort();
        }
        emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,pcVar7,eVar6,puVar5);
        local_2f0 = 7;
        local_2f8 = 8;
        local_c9 = 1;
        local_ca = 0;
        local_74 = 1;
        local_d8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
        ptVar4 = local_d8;
        local_58 = local_d8;
        ptVar9 = local_d8;
        if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow
                             (in_stack_fffffffffffffc80,SUB81((ulong)pcVar7 >> 0x38,0));
          ptVar9 = local_20;
        }
        local_20 = ptVar9;
        local_c8 = ptVar4;
        puVar5 = &local_2f8;
        eVar6 = emitter_type_bool;
        pcVar7 = (char *)0x0;
        iVar3 = duckdb_je_ctl_bymibname
                          (in_stack_fffffffffffffca0,
                           (size_t *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (size_t)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                           (size_t *)in_stack_fffffffffffffc80,(void *)0x0,in_stack_fffffffffffffcc0
                           ,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
        if (iVar3 != 0) {
          duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
          abort();
        }
        emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,pcVar7,eVar6,puVar5);
        local_308[8] = '\a';
        local_308[9] = '\0';
        local_308[10] = '\0';
        local_308[0xb] = '\0';
        local_308[0xc] = '\0';
        local_308[0xd] = '\0';
        local_308[0xe] = '\0';
        local_308[0xf] = '\0';
        local_308[0] = '\x04';
        local_308[1] = '\0';
        local_308[2] = '\0';
        local_308[3] = '\0';
        local_308[4] = '\0';
        local_308[5] = '\0';
        local_308[6] = '\0';
        local_308[7] = '\0';
        local_b1 = 1;
        local_b2 = 0;
        local_75 = 1;
        local_c0 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
        ptVar4 = local_c0;
        local_60 = local_c0;
        ptVar9 = local_c0;
        if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow
                             (in_stack_fffffffffffffc80,SUB81((ulong)pcVar7 >> 0x38,0));
          ptVar9 = local_28;
        }
        local_28 = ptVar9;
        local_b0 = ptVar4;
        in_stack_fffffffffffffc68 = local_308;
        in_stack_fffffffffffffc70 = (emitter_t *)0x0;
        in_stack_fffffffffffffc78 = (char *)0x0;
        iVar3 = duckdb_je_ctl_bymibname
                          (in_stack_fffffffffffffca0,
                           (size_t *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (size_t)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                           (size_t *)in_stack_fffffffffffffc80,(void *)0x0,in_stack_fffffffffffffcc0
                           ,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
        if (iVar3 != 0) {
          duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
          abort();
        }
        emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                        (emitter_type_t)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                        in_stack_fffffffffffffc68);
        emitter_json_object_end((emitter_t *)0x256ca32);
      }
      emitter_json_array_end((emitter_t *)0x256ca55);
    }
    iVar3 = duckdb_je_mallctl(&in_stack_fffffffffffffc90->
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                              in_stack_fffffffffffffc88,(size_t *)in_stack_fffffffffffffc80,
                              in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
    if (iVar3 != 0) {
      duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.nlextents");
      abort();
    }
    emitter_kv((emitter_t *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               &in_stack_fffffffffffffc80->
                cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
               (emitter_type_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),in_stack_fffffffffffffc70)
    ;
    _Var2 = emitter_outputs_json(local_128);
    if (_Var2) {
      emitter_json_array_kv_begin(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      ptVar9 = (tsd_t *)0x7;
      local_99 = 1;
      local_9a = 0;
      local_76 = 1;
      local_a8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
      local_98 = local_a8;
      local_68 = local_a8;
      ptVar4 = local_a8;
      if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
        local_98 = duckdb_je_tsd_fetch_slow
                             (in_stack_fffffffffffffc80,
                              SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0));
        ptVar4 = local_30;
      }
      local_30 = ptVar4;
      iVar3 = duckdb_je_ctl_mibnametomib
                        (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                         (size_t)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         (size_t *)in_stack_fffffffffffffc70);
      if (iVar3 != 0) {
        duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
        abort();
      }
      for (uVar8 = 0; minimal = (undefined1)((ulong)in_stack_fffffffffffffc78 >> 0x38),
          uVar8 < local_30c; uVar8 = uVar8 + 1) {
        emitter_json_object_begin((emitter_t *)0x256cc49);
        miblen = 7;
        pcVar7 = (char *)0x8;
        local_81 = 1;
        local_82 = 0;
        local_77 = 1;
        local_90 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
        ptVar4 = local_90;
        local_70 = local_90;
        ptVar1 = local_90;
        if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(in_stack_fffffffffffffc80,(_Bool)minimal);
          ptVar1 = local_38;
        }
        local_38 = ptVar1;
        local_80 = ptVar4;
        value = &stack0xfffffffffffffc88;
        eVar6 = emitter_type_bool;
        in_stack_fffffffffffffc78 = (char *)0x0;
        iVar3 = duckdb_je_ctl_bymibname
                          (ptVar9,(size_t *)CONCAT44(uVar8,in_stack_fffffffffffffc98),miblen,pcVar7,
                           (size_t *)in_stack_fffffffffffffc80,(void *)0x0,in_stack_fffffffffffffcc0
                           ,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
        if (iVar3 != 0) {
          duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
          abort();
        }
        emitter_json_kv((emitter_t *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,eVar6,value
                       );
        emitter_json_object_end((emitter_t *)0x256cdc5);
      }
      emitter_json_array_end((emitter_t *)0x256cde2);
    }
    emitter_json_object_end((emitter_t *)0x256cdef);
    return;
  }
  duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.nbins");
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_general_print(emitter_t *emitter) {
	const char *cpv;
	bool bv, bv2;
	unsigned uv;
	uint32_t u32v;
	uint64_t u64v;
	int64_t i64v;
	ssize_t ssv, ssv2;
	size_t sv, bsz, usz, u32sz, u64sz, i64sz, ssz, sssz, cpsz;

	bsz = sizeof(bool);
	usz = sizeof(unsigned);
	ssz = sizeof(size_t);
	sssz = sizeof(ssize_t);
	cpsz = sizeof(const char *);
	u32sz = sizeof(uint32_t);
	i64sz = sizeof(int64_t);
	u64sz = sizeof(uint64_t);

	CTL_GET("version", &cpv, const char *);
	emitter_kv(emitter, "version", "Version", emitter_type_string, &cpv);

	/* config. */
	emitter_dict_begin(emitter, "config", "Build-time option settings");
#define CONFIG_WRITE_BOOL(name)						\
	do {								\
		CTL_GET("config."#name, &bv, bool);			\
		emitter_kv(emitter, #name, "config."#name,		\
		    emitter_type_bool, &bv);				\
	} while (0)

	CONFIG_WRITE_BOOL(cache_oblivious);
	CONFIG_WRITE_BOOL(debug);
	CONFIG_WRITE_BOOL(fill);
	CONFIG_WRITE_BOOL(lazy_lock);
	emitter_kv(emitter, "malloc_conf", "config.malloc_conf",
	    emitter_type_string, &config_malloc_conf);

	CONFIG_WRITE_BOOL(opt_safety_checks);
	CONFIG_WRITE_BOOL(prof);
	CONFIG_WRITE_BOOL(prof_libgcc);
	CONFIG_WRITE_BOOL(prof_libunwind);
	CONFIG_WRITE_BOOL(stats);
	CONFIG_WRITE_BOOL(utrace);
	CONFIG_WRITE_BOOL(xmalloc);
#undef CONFIG_WRITE_BOOL
	emitter_dict_end(emitter); /* Close "config" dict. */

	/* opt. */
#define OPT_WRITE(name, var, size, emitter_type)			\
	if (je_mallctl("opt."name, (void *)&var, &size, NULL, 0) ==	\
	    0) {							\
		emitter_kv(emitter, name, "opt."name, emitter_type,	\
		    &var);						\
	}

#define OPT_WRITE_MUTABLE(name, var1, var2, size, emitter_type,		\
    altname)								\
	if (je_mallctl("opt."name, (void *)&var1, &size, NULL, 0) ==	\
	    0 && je_mallctl(altname, (void *)&var2, &size, NULL, 0)	\
	    == 0) {							\
		emitter_kv_note(emitter, name, "opt."name,		\
		    emitter_type, &var1, altname, emitter_type,		\
		    &var2);						\
	}

#define OPT_WRITE_BOOL(name) OPT_WRITE(name, bv, bsz, emitter_type_bool)
#define OPT_WRITE_BOOL_MUTABLE(name, altname)				\
	OPT_WRITE_MUTABLE(name, bv, bv2, bsz, emitter_type_bool, altname)

#define OPT_WRITE_UNSIGNED(name)					\
	OPT_WRITE(name, uv, usz, emitter_type_unsigned)

#define OPT_WRITE_INT64(name)						\
	OPT_WRITE(name, i64v, i64sz, emitter_type_int64)
#define OPT_WRITE_UINT64(name)						\
	OPT_WRITE(name, u64v, u64sz, emitter_type_uint64)

#define OPT_WRITE_SIZE_T(name)						\
	OPT_WRITE(name, sv, ssz, emitter_type_size)
#define OPT_WRITE_SSIZE_T(name)						\
	OPT_WRITE(name, ssv, sssz, emitter_type_ssize)
#define OPT_WRITE_SSIZE_T_MUTABLE(name, altname)			\
	OPT_WRITE_MUTABLE(name, ssv, ssv2, sssz, emitter_type_ssize,	\
	    altname)

#define OPT_WRITE_CHAR_P(name)						\
	OPT_WRITE(name, cpv, cpsz, emitter_type_string)

	emitter_dict_begin(emitter, "opt", "Run-time option settings");

	/*
	 * opt.malloc_conf.
	 *
	 * Sources are documented in https://jemalloc.net/jemalloc.3.html#tuning
	 * - (Not Included Here) The string specified via --with-malloc-conf,
	 *     which is already printed out above as config.malloc_conf
	 * - (Included) The string pointed to by the global variable malloc_conf
	 * - (Included) The “name” of the file referenced by the symbolic link
	 *     named /etc/malloc.conf
	 * - (Included) The value of the environment variable MALLOC_CONF
	 * - (Optional, Unofficial) The string pointed to by the global variable
	 *     malloc_conf_2_conf_harder, which is hidden from the public.
	 *
	 * Note: The outputs are strictly ordered by priorities (low -> high).
	 *
	 */
#define MALLOC_CONF_WRITE(name, message)					\
	if (je_mallctl("opt.malloc_conf."name, (void *)&cpv, &cpsz, NULL, 0) !=	\
	    0) {								\
		cpv = "";							\
	}									\
	emitter_kv(emitter, name, message, emitter_type_string,	&cpv);

	MALLOC_CONF_WRITE("global_var", "Global variable malloc_conf");
	MALLOC_CONF_WRITE("symlink", "Symbolic link malloc.conf");
	MALLOC_CONF_WRITE("env_var", "Environment variable MALLOC_CONF");
	/* As this config is unofficial, skip the output if it's NULL */
	if (je_mallctl("opt.malloc_conf.global_var_2_conf_harder",
	    (void *)&cpv, &cpsz, NULL, 0) == 0) {
		emitter_kv(emitter, "global_var_2_conf_harder", "Global "
		    "variable malloc_conf_2_conf_harder", emitter_type_string, &cpv);
	}
#undef MALLOC_CONF_WRITE

	OPT_WRITE_BOOL("abort")
	OPT_WRITE_BOOL("abort_conf")
	OPT_WRITE_BOOL("cache_oblivious")
	OPT_WRITE_BOOL("confirm_conf")
	OPT_WRITE_BOOL("retain")
	OPT_WRITE_CHAR_P("dss")
	OPT_WRITE_UNSIGNED("narenas")
	OPT_WRITE_CHAR_P("percpu_arena")
	OPT_WRITE_SIZE_T("oversize_threshold")
	OPT_WRITE_BOOL("hpa")
	OPT_WRITE_SIZE_T("hpa_slab_max_alloc")
	OPT_WRITE_SIZE_T("hpa_hugification_threshold")
	OPT_WRITE_UINT64("hpa_hugify_delay_ms")
	OPT_WRITE_UINT64("hpa_min_purge_interval_ms")
	OPT_WRITE_BOOL("hpa_strict_min_purge_interval")
	if (je_mallctl("opt.hpa_dirty_mult", (void *)&u32v, &u32sz, NULL, 0)
	    == 0) {
		/*
		 * We cheat a little and "know" the secret meaning of this
		 * representation.
		 */
		if (u32v == (uint32_t)-1) {
			const char *neg1 = "-1";
			emitter_kv(emitter, "hpa_dirty_mult",
			    "opt.hpa_dirty_mult", emitter_type_string, &neg1);
		} else {
			char buf[FXP_BUF_SIZE];
			fxp_print(u32v, buf);
			const char *bufp = buf;
			emitter_kv(emitter, "hpa_dirty_mult",
			    "opt.hpa_dirty_mult", emitter_type_string, &bufp);
		}
	}
	OPT_WRITE_SIZE_T("hpa_sec_nshards")
	OPT_WRITE_SIZE_T("hpa_sec_max_alloc")
	OPT_WRITE_SIZE_T("hpa_sec_max_bytes")
	OPT_WRITE_SIZE_T("hpa_sec_bytes_after_flush")
	OPT_WRITE_SIZE_T("hpa_sec_batch_fill_extra")
	OPT_WRITE_CHAR_P("metadata_thp")
	OPT_WRITE_INT64("mutex_max_spin")
	OPT_WRITE_BOOL_MUTABLE("background_thread", "background_thread")
	OPT_WRITE_SSIZE_T_MUTABLE("dirty_decay_ms", "arenas.dirty_decay_ms")
	OPT_WRITE_SSIZE_T_MUTABLE("muzzy_decay_ms", "arenas.muzzy_decay_ms")
	OPT_WRITE_SIZE_T("lg_extent_max_active_fit")
	OPT_WRITE_CHAR_P("junk")
	OPT_WRITE_BOOL("zero")
	OPT_WRITE_BOOL("utrace")
	OPT_WRITE_BOOL("xmalloc")
	OPT_WRITE_BOOL("experimental_infallible_new")
	OPT_WRITE_SIZE_T("max_batched_size")
	OPT_WRITE_SIZE_T("remote_free_max")
	OPT_WRITE_SIZE_T("remote_free_max_batch")
	OPT_WRITE_BOOL("tcache")
	OPT_WRITE_SIZE_T("tcache_max")
	OPT_WRITE_UNSIGNED("tcache_nslots_small_min")
	OPT_WRITE_UNSIGNED("tcache_nslots_small_max")
	OPT_WRITE_UNSIGNED("tcache_nslots_large")
	OPT_WRITE_SSIZE_T("lg_tcache_nslots_mul")
	OPT_WRITE_SIZE_T("tcache_gc_incr_bytes")
	OPT_WRITE_SIZE_T("tcache_gc_delay_bytes")
	OPT_WRITE_UNSIGNED("lg_tcache_flush_small_div")
	OPT_WRITE_UNSIGNED("lg_tcache_flush_large_div")
	OPT_WRITE_UNSIGNED("debug_double_free_max_scan")
	OPT_WRITE_CHAR_P("thp")
	OPT_WRITE_BOOL("prof")
	OPT_WRITE_UNSIGNED("prof_bt_max")
	OPT_WRITE_CHAR_P("prof_prefix")
	OPT_WRITE_BOOL_MUTABLE("prof_active", "prof.active")
	OPT_WRITE_BOOL_MUTABLE("prof_thread_active_init",
	    "prof.thread_active_init")
	OPT_WRITE_SSIZE_T_MUTABLE("lg_prof_sample", "prof.lg_sample")
	OPT_WRITE_BOOL("prof_accum")
	OPT_WRITE_SSIZE_T("lg_prof_interval")
	OPT_WRITE_BOOL("prof_gdump")
	OPT_WRITE_BOOL("prof_final")
	OPT_WRITE_BOOL("prof_leak")
	OPT_WRITE_BOOL("prof_leak_error")
	OPT_WRITE_BOOL("stats_print")
	OPT_WRITE_CHAR_P("stats_print_opts")
	OPT_WRITE_BOOL("stats_print")
	OPT_WRITE_CHAR_P("stats_print_opts")
	OPT_WRITE_INT64("stats_interval")
	OPT_WRITE_CHAR_P("stats_interval_opts")
	OPT_WRITE_CHAR_P("zero_realloc")

	emitter_dict_end(emitter); /* Close "opt". */

#undef OPT_WRITE
#undef OPT_WRITE_MUTABLE
#undef OPT_WRITE_BOOL
#undef OPT_WRITE_BOOL_MUTABLE
#undef OPT_WRITE_UNSIGNED
#undef OPT_WRITE_SSIZE_T
#undef OPT_WRITE_SSIZE_T_MUTABLE
#undef OPT_WRITE_CHAR_P

	/* prof. */
	if (config_prof) {
		emitter_dict_begin(emitter, "prof", "Profiling settings");

		CTL_GET("prof.thread_active_init", &bv, bool);
		emitter_kv(emitter, "thread_active_init",
		    "prof.thread_active_init", emitter_type_bool, &bv);

		CTL_GET("prof.active", &bv, bool);
		emitter_kv(emitter, "active", "prof.active", emitter_type_bool,
		    &bv);

		CTL_GET("prof.gdump", &bv, bool);
		emitter_kv(emitter, "gdump", "prof.gdump", emitter_type_bool,
		    &bv);

		CTL_GET("prof.interval", &u64v, uint64_t);
		emitter_kv(emitter, "interval", "prof.interval",
		    emitter_type_uint64, &u64v);

		CTL_GET("prof.lg_sample", &ssv, ssize_t);
		emitter_kv(emitter, "lg_sample", "prof.lg_sample",
		    emitter_type_ssize, &ssv);

		emitter_dict_end(emitter); /* Close "prof". */
	}

	/* arenas. */
	/*
	 * The json output sticks arena info into an "arenas" dict; the table
	 * output puts them at the top-level.
	 */
	emitter_json_object_kv_begin(emitter, "arenas");

	CTL_GET("arenas.narenas", &uv, unsigned);
	emitter_kv(emitter, "narenas", "Arenas", emitter_type_unsigned, &uv);

	/*
	 * Decay settings are emitted only in json mode; in table mode, they're
	 * emitted as notes with the opt output, above.
	 */
	CTL_GET("arenas.dirty_decay_ms", &ssv, ssize_t);
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize, &ssv);

	CTL_GET("arenas.muzzy_decay_ms", &ssv, ssize_t);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize, &ssv);

	CTL_GET("arenas.quantum", &sv, size_t);
	emitter_kv(emitter, "quantum", "Quantum size", emitter_type_size, &sv);

	CTL_GET("arenas.page", &sv, size_t);
	emitter_kv(emitter, "page", "Page size", emitter_type_size, &sv);

	CTL_GET("arenas.hugepage", &sv, size_t);
	emitter_kv(emitter, "hugepage", "Hugepage size", emitter_type_size,
	    &sv);

	if (je_mallctl("arenas.tcache_max", (void *)&sv, &ssz, NULL, 0) == 0) {
		emitter_kv(emitter, "tcache_max",
		    "Maximum thread-cached size class", emitter_type_size, &sv);
	}

	unsigned arenas_nbins;
	CTL_GET("arenas.nbins", &arenas_nbins, unsigned);
	emitter_kv(emitter, "nbins", "Number of bin size classes",
	    emitter_type_unsigned, &arenas_nbins);

	unsigned arenas_nhbins;
	CTL_GET("arenas.nhbins", &arenas_nhbins, unsigned);
	emitter_kv(emitter, "nhbins", "Number of thread-cache bin size classes",
	    emitter_type_unsigned, &arenas_nhbins);

	/*
	 * We do enough mallctls in a loop that we actually want to omit them
	 * (not just omit the printing).
	 */
	if (emitter_outputs_json(emitter)) {
		emitter_json_array_kv_begin(emitter, "bin");
		size_t arenas_bin_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(arenas_bin_mib, 0, "arenas.bin");
		for (unsigned i = 0; i < arenas_nbins; i++) {
			arenas_bin_mib[2] = i;
			emitter_json_object_begin(emitter);

			CTL_LEAF(arenas_bin_mib, 3, "size", &sv, size_t);
			emitter_json_kv(emitter, "size", emitter_type_size,
			    &sv);

			CTL_LEAF(arenas_bin_mib, 3, "nregs", &u32v, uint32_t);
			emitter_json_kv(emitter, "nregs", emitter_type_uint32,
			    &u32v);

			CTL_LEAF(arenas_bin_mib, 3, "slab_size", &sv, size_t);
			emitter_json_kv(emitter, "slab_size", emitter_type_size,
			    &sv);

			CTL_LEAF(arenas_bin_mib, 3, "nshards", &u32v, uint32_t);
			emitter_json_kv(emitter, "nshards", emitter_type_uint32,
			    &u32v);

			emitter_json_object_end(emitter);
		}
		emitter_json_array_end(emitter); /* Close "bin". */
	}

	unsigned nlextents;
	CTL_GET("arenas.nlextents", &nlextents, unsigned);
	emitter_kv(emitter, "nlextents", "Number of large size classes",
	    emitter_type_unsigned, &nlextents);

	if (emitter_outputs_json(emitter)) {
		emitter_json_array_kv_begin(emitter, "lextent");
		size_t arenas_lextent_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(arenas_lextent_mib, 0, "arenas.lextent");
		for (unsigned i = 0; i < nlextents; i++) {
			arenas_lextent_mib[2] = i;
			emitter_json_object_begin(emitter);

			CTL_LEAF(arenas_lextent_mib, 3, "size", &sv, size_t);
			emitter_json_kv(emitter, "size", emitter_type_size,
			    &sv);

			emitter_json_object_end(emitter);
		}
		emitter_json_array_end(emitter); /* Close "lextent". */
	}

	emitter_json_object_end(emitter); /* Close "arenas" */
}